

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

int generator_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  uint32_t size;
  code *pcVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  uint32_t samples;
  float *out;
  uint32_t local_3c;
  double local_38;
  float *local_30;
  
  puVar2 = (undefined8 *)segment->data;
  local_38 = (double)puVar2[2];
  if (*(int *)(puVar2 + 1) - 1U < 4) {
    pcVar3 = (code *)(&PTR_sine_wave_002ba980)[*(int *)(puVar2 + 1) - 1U];
  }
  else {
    pcVar3 = (code *)0x0;
  }
  fVar1 = *(float *)((long)puVar2 + 0x1c);
  local_3c = 0xffffffff;
  mixed_buffer_request_write(&local_30,&local_3c,(mixed_buffer *)*puVar2);
  uVar4 = (ulong)local_38;
  size = 0;
  if (local_3c != 0) {
    uVar5 = 0;
    do {
      fVar6 = (float)(*pcVar3)(*(undefined4 *)((long)puVar2 + 0xc),(double)(uVar4 & 0xffffffff),
                               (float)*(uint *)(puVar2 + 3));
      local_30[uVar5] = fVar6 * fVar1;
      dVar7 = fmod((double)((int)uVar4 + 1),(double)*(uint *)(puVar2 + 3));
      uVar5 = uVar5 + 1;
      uVar4 = (ulong)dVar7;
      size = local_3c;
    } while (uVar5 < local_3c);
  }
  mixed_buffer_finish_write(size,(mixed_buffer *)*puVar2);
  puVar2[2] = (double)(uVar4 & 0xffffffff);
  return 1;
}

Assistant:

int generator_segment_mix(struct mixed_segment *segment){
  struct generator_segment_data *data = (struct generator_segment_data *)segment->data;
  uint32_t phase = data->phase;
  float (*generator)(float frequency, double phase, float samplerate) = 0;
  float volume = data->volume;

  switch(data->type){
  case MIXED_SINE: generator = sine_wave; break;
  case MIXED_SQUARE: generator = square_wave; break;
  case MIXED_TRIANGLE: generator = triangle_wave; break;
  case MIXED_SAWTOOTH: generator = sawtooth_wave; break;
  }
  
  float *restrict out;
  uint32_t samples = UINT32_MAX;
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = generator(data->frequency, phase, data->samplerate) * volume;
    phase = fmod(phase+1, data->samplerate);
  }
  mixed_buffer_finish_write(samples, data->out);

  data->phase = phase;
  return 1;
}